

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O2

void jsonEscape(FILE *stream,char *in)

{
  char cVar1;
  size_t sVar2;
  char *__s;
  char *pcVar3;
  
  sVar2 = strlen(in);
  pcVar3 = in + sVar2;
  do {
    if (pcVar3 <= in) {
      return;
    }
    cVar1 = *in;
    switch(cVar1) {
    case '\b':
      __s = "\\b";
      break;
    case '\t':
      __s = "\\t";
      break;
    case '\n':
      __s = "\\n";
      break;
    case '\v':
switchD_0011ccfb_caseD_b:
      if (cVar1 < ' ') {
        curl_mfprintf(stream,"u%04x");
      }
      else {
        fputc((int)cVar1,(FILE *)stream);
      }
      goto LAB_0011cd5f;
    case '\f':
      __s = "\\f";
      break;
    case '\r':
      __s = "\\r";
      break;
    default:
      if (cVar1 == '\"') {
        __s = "\\\"";
      }
      else {
        if (cVar1 != '\\') goto switchD_0011ccfb_caseD_b;
        __s = "\\\\";
      }
    }
    fputs(__s,(FILE *)stream);
LAB_0011cd5f:
    in = in + 1;
  } while( true );
}

Assistant:

static void jsonEscape(FILE *stream, const char *in)
{
  const char *i = in;
  const char *in_end = in + strlen(in);

  for(; i < in_end; i++) {
    switch(*i) {
    case '\\':
      fputs("\\\\", stream);
      break;
    case '\"':
      fputs("\\\"", stream);
      break;
    case '\b':
      fputs("\\b", stream);
      break;
    case '\f':
      fputs("\\f", stream);
      break;
    case '\n':
      fputs("\\n", stream);
      break;
    case '\r':
      fputs("\\r", stream);
      break;
    case '\t':
      fputs("\\t", stream);
      break;
    default:
      if (*i < 32) {
        fprintf(stream, "u%04x", *i);
      }
      else {
        fputc(*i, stream);
      }
      break;
    };
  }
}